

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrgls_DataBlob_impl.hpp
# Opt level: O0

timeval __thiscall hrgls::datablob::DataBlob::Time(DataBlob *this)

{
  hrgls_Status hVar1;
  DataBlob *this_local;
  timeval ret;
  
  memset(&this_local,0,0x10);
  if (this->m_private->blob == (hrgls_DataBlob)0x0) {
    this->m_private->status = 0x3ee;
  }
  else {
    hVar1 = hrgls_DataBlobGetTime(this->m_private->blob,&this_local);
    this->m_private->status = hVar1;
  }
  return _this_local;
}

Assistant:

struct timeval DataBlob::Time() const
    {
      struct timeval ret = {};
      if (!m_private->blob) {
        m_private->status = hrgls_STATUS_NULL_OBJECT_POINTER;
        return ret;
      }
      if (hrgls_STATUS_OKAY !=
        (m_private->status = hrgls_DataBlobGetTime(m_private->blob, &ret))) {
        return ret;
      }
      return ret;
    }